

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.hpp
# Opt level: O0

void __thiscall
TasGrid::GridGlobal::GridGlobal
          (GridGlobal *this,AccelerationContext *acc,int cnum_dimensions,int cnum_outputs,int depth,
          TypeDepth type,TypeOneDRule crule,vector<int,_std::allocator<int>_> *anisotropic_weights,
          double calpha,double cbeta,char *custom_filename,
          vector<int,_std::allocator<int>_> *level_limits)

{
  double cbeta_local;
  double calpha_local;
  TypeDepth type_local;
  int depth_local;
  int cnum_outputs_local;
  int cnum_dimensions_local;
  AccelerationContext *acc_local;
  GridGlobal *this_local;
  
  BaseCanonicalGrid::BaseCanonicalGrid(&this->super_BaseCanonicalGrid,acc);
  (this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid = (_func_int **)&PTR__GridGlobal_003511b0;
  OneDimensionalWrapper::OneDimensionalWrapper(&this->wrapper);
  MultiIndexSet::MultiIndexSet(&this->tensors);
  MultiIndexSet::MultiIndexSet(&this->active_tensors);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->active_w);
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&this->tensor_refs);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->max_levels);
  MultiIndexSet::MultiIndexSet(&this->updated_tensors);
  MultiIndexSet::MultiIndexSet(&this->updated_active_tensors);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->updated_active_w);
  CustomTabulated::CustomTabulated(&this->custom);
  ::std::
  unique_ptr<TasGrid::DynamicConstructorDataGlobal,std::default_delete<TasGrid::DynamicConstructorDataGlobal>>
  ::unique_ptr<std::default_delete<TasGrid::DynamicConstructorDataGlobal>,void>
            ((unique_ptr<TasGrid::DynamicConstructorDataGlobal,std::default_delete<TasGrid::DynamicConstructorDataGlobal>>
              *)&this->dynamic_values);
  ::std::
  unique_ptr<TasGrid::CudaGlobalData<double>,std::default_delete<TasGrid::CudaGlobalData<double>>>::
  unique_ptr<std::default_delete<TasGrid::CudaGlobalData<double>>,void>
            ((unique_ptr<TasGrid::CudaGlobalData<double>,std::default_delete<TasGrid::CudaGlobalData<double>>>
              *)&this->gpu_cache);
  ::std::
  unique_ptr<TasGrid::CudaGlobalData<float>,std::default_delete<TasGrid::CudaGlobalData<float>>>::
  unique_ptr<std::default_delete<TasGrid::CudaGlobalData<float>>,void>
            ((unique_ptr<TasGrid::CudaGlobalData<float>,std::default_delete<TasGrid::CudaGlobalData<float>>>
              *)&this->gpu_cachef);
  makeGrid(this,cnum_dimensions,cnum_outputs,depth,type,crule,anisotropic_weights,calpha,cbeta,
           custom_filename,level_limits);
  return;
}

Assistant:

GridGlobal(AccelerationContext const *acc, int cnum_dimensions, int cnum_outputs, int depth, TypeDepth type, TypeOneDRule crule, const std::vector<int> &anisotropic_weights, double calpha, double cbeta, const char* custom_filename, const std::vector<int> &level_limits) : BaseCanonicalGrid(acc){
        makeGrid(cnum_dimensions, cnum_outputs, depth, type, crule, anisotropic_weights, calpha, cbeta, custom_filename, level_limits);
    }